

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O2

void gz_compress(FILE *in,gzFile out)

{
  int iVar1;
  size_t sVar2;
  char *msg;
  int err;
  char buf [16384];
  
  while( true ) {
    sVar2 = fread(buf,1,0x4000,(FILE *)in);
    iVar1 = ferror((FILE *)in);
    if (iVar1 != 0) {
      perror("fread");
      exit(1);
    }
    if ((int)sVar2 == 0) break;
    iVar1 = gzwrite(out,buf,sVar2 & 0xffffffff);
    if (iVar1 != (int)sVar2) {
      msg = (char *)gzerror(out,&err);
      error(msg);
    }
  }
  fclose((FILE *)in);
  iVar1 = gzclose(out);
  if (iVar1 == 0) {
    return;
  }
  error("failed gzclose");
}

Assistant:

void gz_compress(in, out)
    FILE   *in;
    gzFile out;
{
    local char buf[BUFLEN];
    int len;
    int err;

#ifdef USE_MMAP
    /* Try first compressing with mmap. If mmap fails (minigzip used in a
     * pipe), use the normal fread loop.
     */
    if (gz_compress_mmap(in, out) == Z_OK) return;
#endif
    for (;;) {
        len = (int)fread(buf, 1, sizeof(buf), in);
        if (ferror(in)) {
            perror("fread");
            exit(1);
        }
        if (len == 0) break;

        if (gzwrite(out, buf, (unsigned)len) != len) error(gzerror(out, &err));
    }
    fclose(in);
    if (gzclose(out) != Z_OK) error("failed gzclose");
}